

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  size_t buflen;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined1 *__dest;
  SSL *pSVar6;
  undefined8 uVar7;
  char *__s;
  undefined8 uVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  char *session_data;
  uint16_t uVar12;
  http_parser_url local_108;
  undefined8 local_e8;
  void *local_e0;
  SSL_CTX *local_d8;
  char *local_d0;
  _union_1457 local_c8;
  undefined1 local_c0 [144];
  
  if (argc < 2) {
    fwrite("Usage: libevent-client HTTPS_URI\n",0x21,1,_stderr);
    exit(1);
  }
  memset(local_c0,0,0x90);
  local_c8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
  __s = argv[1];
  buflen = strlen(__s);
  iVar1 = http_parser_parse_url(__s,buflen,0,&local_108);
  if (iVar1 == 0) {
    local_d0 = strndup(__s + local_108.field_data[1].off,(ulong)local_108.field_data[1].len);
    uVar9 = 0x1bb;
    if ((local_108.field_set & 4) != 0) {
      uVar9 = local_108.port;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar2 = SSL_CTX_new(meth);
    if (pSVar2 == (SSL_CTX *)0x0) {
      uVar11 = ERR_get_error();
      __s = ERR_error_string(uVar11,(char *)0x0);
      session_data = "Could not create SSL/TLS context: %s";
    }
    else {
      SSL_CTX_set_options(pSVar2,0x82030850);
      local_d8 = pSVar2;
      SSL_CTX_set_alpn_protos(pSVar2,"\x02h2",3);
      uVar3 = event_base_new();
      uVar11 = 1;
      pvVar4 = calloc(1,0x20);
      local_e8 = uVar3;
      uVar3 = evdns_base_new(uVar3,1);
      *(undefined8 *)((long)pvVar4 + 8) = uVar3;
      local_e0 = pvVar4;
      puVar5 = (undefined8 *)malloc(0x38);
      *puVar5 = __s;
      puVar5[1] = &local_108;
      *(undefined4 *)(puVar5 + 6) = 0xffffffff;
      uVar10 = (ulong)local_108.field_data[1].len;
      puVar5[4] = uVar10;
      pvVar4 = malloc(uVar10 + 7);
      puVar5[2] = pvVar4;
      memcpy(pvVar4,__s + local_108.field_data[1].off,uVar10);
      uVar12 = local_108.field_set;
      if ((local_108.field_set & 4) != 0) {
        iVar1 = snprintf((char *)((long)pvVar4 + uVar10),7,":%u",(ulong)local_108.port);
        puVar5[4] = (long)iVar1 + uVar10;
        uVar12 = local_108.field_set;
      }
      puVar5[5] = 1;
      if ((uVar12 & 8) != 0) {
        uVar11 = (ulong)local_108.field_data[3].len;
        puVar5[5] = uVar11;
      }
      if ((uVar12 & 0x10) != 0) {
        uVar11 = uVar11 + local_108.field_data[4].len + 1;
        puVar5[5] = uVar11;
      }
      __dest = (undefined1 *)malloc(uVar11);
      puVar5[3] = __dest;
      if ((uVar12 & 8) == 0) {
        *__dest = 0x2f;
      }
      else {
        memcpy(__dest,__s + local_108.field_data[3].off,(ulong)local_108.field_data[3].len);
      }
      if ((uVar12 & 0x10) != 0) {
        uVar10 = (ulong)local_108.field_data[4].len;
        __dest[~uVar10 + uVar11] = 0x3f;
        memcpy(__dest + (uVar11 - uVar10),__s + local_108.field_data[4].off,uVar10);
      }
      pSVar2 = local_d8;
      pvVar4 = local_e0;
      *(undefined8 **)((long)local_e0 + 0x18) = puVar5;
      pSVar6 = SSL_new(local_d8);
      uVar3 = local_e8;
      if (pSVar6 == (SSL *)0x0) {
        uVar11 = ERR_get_error();
        __s = ERR_error_string(uVar11,(char *)0x0);
        session_data = "Could not create SSL/TLS session object: %s";
      }
      else {
        uVar7 = bufferevent_openssl_socket_new(local_e8,0xffffffffffffffff,pSVar6,1,5);
        bufferevent_enable(uVar7,6);
        bufferevent_setcb(uVar7,readcb,writecb,eventcb,pvVar4);
        __s = local_d0;
        iVar1 = bufferevent_socket_connect_hostname
                          (uVar7,*(undefined8 *)((long)pvVar4 + 8),0,local_d0,uVar9);
        if (iVar1 == 0) {
          *(undefined8 *)((long)pvVar4 + 0x10) = uVar7;
          free(__s);
          event_base_loop(uVar3,0);
          event_base_free(uVar3);
          SSL_CTX_free(pSVar2);
          return 0;
        }
        session_data = "Could not connect to the remote host %s";
      }
    }
  }
  else {
    session_data = "Could not parse URI %s";
  }
  errx(1,session_data,__s);
  uVar3 = bufferevent_get_input();
  uVar7 = evbuffer_get_length(uVar3);
  uVar8 = evbuffer_pullup(uVar3,0xffffffffffffffff);
  uVar11 = nghttp2_session_mem_recv2(((http2_session_data *)session_data)->session,uVar8,uVar7);
  if ((long)uVar11 < 0) {
    uVar3 = nghttp2_strerror(uVar11 & 0xffffffff);
    warnx("Fatal error: %s",uVar3);
  }
  else {
    iVar1 = evbuffer_drain(uVar3,uVar11);
    if (iVar1 == 0) {
      iVar1 = session_send((http2_session_data *)session_data);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      warnx("Fatal error: evbuffer_drain failed");
    }
  }
  delete_http2_session_data((http2_session_data *)session_data);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 2) {
    fprintf(stderr, "Usage: libevent-client HTTPS_URI\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1]);
  return 0;
}